

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O1

double pae(jas_matrix_t *x,jas_matrix_t *y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  if (x->numrows_ < 1) {
    return 0.0;
  }
  dVar5 = 0.0;
  lVar1 = 0;
  do {
    if (0 < x->numcols_) {
      lVar3 = 0;
      dVar6 = dVar5;
      do {
        lVar4 = y->rows_[lVar1][lVar3] - x->rows_[lVar1][lVar3];
        lVar2 = -lVar4;
        if (0 < lVar4) {
          lVar2 = lVar4;
        }
        dVar5 = (double)lVar2;
        if ((double)lVar2 <= dVar6) {
          dVar5 = dVar6;
        }
        lVar3 = lVar3 + 1;
        dVar6 = dVar5;
      } while (x->numcols_ != lVar3);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != x->numrows_);
  return dVar5;
}

Assistant:

double pae(jas_matrix_t *x, jas_matrix_t *y)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = JAS_ABS(jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j));
			if (d > s) {
				s = d;
			}
		}
	}

	return s;
}